

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  int iVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  type tVar5;
  type tVar6;
  appender aVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  sign_t sVar15;
  bool bVar16;
  locale_ref in_stack_fffffffffffffef8;
  char local_f9;
  bool pointy;
  undefined3 uStack_f7;
  int significand_size;
  sign_t sign;
  significand_type significand;
  locale_ref local_e8;
  ulong local_e0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_d8;
  basic_format_specs<char> *local_d0;
  ulong local_c8;
  int local_bc;
  significand_type local_b8;
  int exp;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_28_7_94dcc806 write;
  undefined4 uStack_64;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = fp->significand;
  local_e8.locale_ = loc.locale_;
  local_d8 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_d0 = specs;
  local_b8 = significand;
  fspecs_local = fspecs;
  iVar4 = get_significand_size<float>(fp);
  sVar15 = fspecs._4_4_ >> 8;
  sign = sVar15 & 0xff;
  bVar16 = sign != none;
  significand_size = iVar4;
  tVar5 = to_unsigned<int>(iVar4);
  local_e0 = (ulong)(bVar16 + tVar5);
  cVar3 = '.';
  local_c8 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    cVar3 = decimal_point_impl<char>(in_stack_fffffffffffffef8);
  }
  iVar13 = fp->exponent;
  local_bc = iVar4 + iVar13 + -1;
  local_f9 = cVar3;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_bc;
  bVar16 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
           anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar12 = local_e0;
  uVar11 = fspecs.precision;
  uVar9 = (uint)local_c8;
  if (bVar16) {
    iVar13 = iVar13 + iVar4;
    if ((uVar9 >> 0x14 & 1) == 0) {
      local_e8.locale_ = (void *)((ulong)local_e8.locale_._4_4_ << 0x20);
      if (iVar4 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      local_e8.locale_._0_4_ = 0;
      if (0 < (int)(uVar11 - iVar4)) {
        local_e8.locale_._0_4_ = uVar11 - iVar4;
      }
      tVar5 = to_unsigned<int>((int)local_e8.locale_);
      uVar12 = local_e0 + tVar5;
    }
    iVar2 = local_bc;
    iVar1 = 1 - iVar13;
    if (0 < iVar13) {
      iVar1 = local_bc;
    }
    iVar13 = 2;
    if (99 < iVar1) {
      iVar13 = (999 < iVar1) + 3;
    }
    tVar5 = to_unsigned<int>((3 - (uint)(cVar3 == '\0')) + iVar13);
    write._0_8_ = CONCAT44(local_b8,sVar15) & 0xffffffff000000ff;
    write.decimal_point = cVar3;
    write.significand_size = iVar4;
    write._16_8_ = CONCAT35(write._21_3_,
                            CONCAT14(((uVar9 >> 0x10 & 1) == 0) << 5,(int)local_e8.locale_)) |
                   0x4500000000;
    stack0xffffffffffffff98 = (decimal_fp<float> *)CONCAT44(uStack_64,iVar2);
    if (0 < local_d0->width) {
      aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        ((appender)local_d8.container,local_d0,uVar12 + tVar5,&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar7 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
            anon_class_28_7_94dcc806::operator()(&write,(iterator)local_d8.container);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar1 = fp->exponent;
  iVar13 = iVar4 + iVar1;
  exp = iVar13;
  if (iVar1 < 0) {
    if (iVar13 < 1) {
      uVar10 = -iVar13;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      if (uVar11 < uVar10) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar11;
      }
      if ((int)uVar11 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if (iVar4 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if (iVar4 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_f7,(char)((uVar9 & 0x100000) >> 0x14));
        if ((local_c8 & 0x100000) == 0) {
          iVar4 = 1;
          goto LAB_0011e00b;
        }
      }
      else {
        _pointy = CONCAT31(uStack_f7,1);
      }
      iVar4 = 2;
LAB_0011e00b:
      tVar5 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write._8_8_ = &pointy;
      write._16_8_ = &local_f9;
      unique0x00004e80 = (decimal_fp<float> *)&grouping;
      aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>
                        ((appender)local_d8.container,local_d0,(iVar4 + tVar5) + uVar12,
                         (anon_class_48_6_d9b5e731 *)&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    _pointy = uVar11 - iVar4 & (int)(uVar9 << 0xb) >> 0x1f;
    uVar11 = _pointy;
    if ((int)_pointy < 1) {
      uVar11 = 0;
    }
    tVar5 = to_unsigned<int>(uVar11);
    digit_grouping<char>::digit_grouping(&grouping,local_e8,(bool)((byte)(uVar9 >> 0x11) & 1));
    iVar4 = digit_grouping<char>::count_separators(&grouping,significand_size);
    tVar6 = to_unsigned<int>(iVar4);
    write._0_8_ = &sign;
    write._8_8_ = &significand;
    write._16_8_ = &significand_size;
    unique0x00004e80 = (decimal_fp<float> *)&exp;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>
                   (local_d8.container,local_d0,(ulong)tVar6 + (tVar5 + 1) + local_e0,
                    (anon_class_56_7_aadf885c *)&write);
    goto LAB_0011dfaf;
  }
  tVar5 = to_unsigned<int>(iVar1);
  lVar14 = tVar5 + local_e0;
  _pointy = uVar11 - iVar13;
  uVar9 = (uint)local_c8;
  if ((uVar9 >> 0x14 & 1) != 0) {
    if ((char)local_c8 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_0011df26;
    }
    else {
      _pointy = 1;
    }
    tVar5 = to_unsigned<int>(_pointy);
    lVar14 = lVar14 + (ulong)(tVar5 + 1);
  }
LAB_0011df26:
  digit_grouping<char>::digit_grouping(&grouping,local_e8,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar4 = digit_grouping<char>::count_separators(&grouping,significand_size);
  tVar5 = to_unsigned<int>(iVar4);
  write._0_8_ = &sign;
  write._8_8_ = &significand;
  write._16_8_ = &significand_size;
  unique0x100003f8 = fp;
  bVar8.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>
                 (local_d8.container,local_d0,lVar14 + (ulong)tVar5,
                  (anon_class_64_8_b997adb5 *)&write);
LAB_0011dfaf:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar8.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 locale_ref loc) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}